

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::addSingleton(ISingleton *singleton)

{
  value_type local_10;
  
  anon_unknown_23::getSingletons();
  std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::push_back
            (anon_unknown_23::getSingletons::g_singletons,&local_10);
  return;
}

Assistant:

void addSingleton(ISingleton *singleton) {
        getSingletons()->push_back(singleton);
    }